

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::ObjectIntersectorK<4,_false>_>,_false>
     ::occludedCoherent(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  AccelData *pAVar2;
  undefined1 auVar3 [16];
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  long lVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  StackItemMaskT<embree::NodeRefPtr<8>_> *pSVar32;
  uint uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  Geometry *pGVar36;
  RTCIntersectFunctionN p_Var37;
  ulong uVar38;
  size_t sVar39;
  uint uVar40;
  ulong uVar41;
  size_t sVar42;
  size_t sVar43;
  Geometry *pGVar44;
  size_t sVar45;
  ulong uVar46;
  StackItemMaskT<embree::NodeRefPtr<8>_> *pSVar47;
  StackItemMaskT<embree::NodeRefPtr<8>_> *pSVar48;
  ulong uVar49;
  ulong uVar50;
  undefined8 uVar51;
  vint4 ai;
  undefined1 auVar54 [16];
  undefined8 uVar52;
  undefined8 uVar53;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  float fVar60;
  float fVar61;
  float fVar66;
  float fVar68;
  vint4 ai_1;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar67;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  vint4 ai_3;
  undefined1 auVar72 [16];
  vint4 bi;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  vint4 bi_1;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined4 uVar78;
  vint4 bi_3;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  vint4 ai_2;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  vint4 bi_2;
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  vint<4> octant;
  undefined8 local_2748;
  vint4 bi_8;
  undefined1 local_26c8 [16];
  undefined1 local_2698 [16];
  RTCIntersectFunctionNArguments local_2680;
  Geometry *local_2650;
  undefined8 local_2648;
  RTCIntersectArguments *local_2640;
  anon_union_16_2_9473010e_for_vint_impl<4>_1 local_2638;
  undefined4 local_2628;
  undefined4 uStack_2624;
  undefined4 uStack_2620;
  undefined4 uStack_261c;
  undefined1 local_2618 [16];
  float local_2608;
  float fStack_2604;
  float fStack_2600;
  float fStack_25fc;
  float local_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float local_25e8;
  float fStack_25e4;
  float fStack_25e0;
  float fStack_25dc;
  undefined1 local_25d8 [16];
  undefined1 local_25c8 [16];
  undefined1 local_25b8 [16];
  undefined1 local_25a8 [16];
  undefined8 local_2598;
  undefined8 uStack_2590;
  undefined1 local_2588 [16];
  float local_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  float fStack_2564;
  float fStack_2560;
  float fStack_255c;
  float local_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  float fStack_2540;
  float fStack_253c;
  float local_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  vint<4> mask;
  StackItemMaskT<embree::NodeRefPtr<8>_> stack [564];
  
  auVar5 = vpcmpeqd_avx(in_ZMM12._0_16_,in_ZMM12._0_16_);
  auVar90 = ZEXT1664(auVar5);
  auVar54 = vpcmpeqd_avx(auVar5,(undefined1  [16])valid_i->field_0);
  uVar33 = vmovmskps_avx(auVar54);
  if (uVar33 == 0) {
    return;
  }
  local_2638 = valid_i->field_0;
  pAVar2 = This->ptr;
  uVar41 = (ulong)(uVar33 & 0xff);
  auVar75._8_4_ = 0x7fffffff;
  auVar75._0_8_ = 0x7fffffff7fffffff;
  auVar75._12_4_ = 0x7fffffff;
  auVar65 = *(undefined1 (*) [16])(ray + 0x40);
  auVar58 = vandps_avx(auVar65,auVar75);
  auVar79._8_4_ = 0x219392ef;
  auVar79._0_8_ = 0x219392ef219392ef;
  auVar79._12_4_ = 0x219392ef;
  auVar58 = vcmpps_avx(auVar58,auVar79,1);
  auVar62 = vblendvps_avx(auVar65,auVar79,auVar58);
  auVar58 = *(undefined1 (*) [16])(ray + 0x50);
  auVar88 = vandps_avx(auVar58,auVar75);
  auVar88 = vcmpps_avx(auVar88,auVar79,1);
  auVar63 = vblendvps_avx(auVar58,auVar79,auVar88);
  auVar88 = *(undefined1 (*) [16])(ray + 0x60);
  auVar75 = vandps_avx(auVar88,auVar75);
  auVar75 = vcmpps_avx(auVar75,auVar79,1);
  auVar75 = vblendvps_avx(auVar88,auVar79,auVar75);
  auVar73 = vrcpps_avx(auVar62);
  auVar81._8_4_ = 0x3f800000;
  auVar81._0_8_ = 0x3f8000003f800000;
  auVar81._12_4_ = 0x3f800000;
  auVar62 = vfnmadd213ps_fma(auVar62,auVar73,auVar81);
  local_25b8 = vfmadd132ps_fma(auVar62,auVar73,auVar73);
  auVar91 = ZEXT1664(local_25b8);
  auVar62 = vrcpps_avx(auVar63);
  auVar63 = vfnmadd213ps_fma(auVar63,auVar62,auVar81);
  local_25c8 = vfmadd132ps_fma(auVar63,auVar62,auVar62);
  auVar92 = ZEXT1664(local_25c8);
  auVar62 = vrcpps_avx(auVar75);
  auVar75 = vfnmadd213ps_fma(auVar75,auVar62,auVar81);
  local_25d8 = vfmadd132ps_fma(auVar75,auVar62,auVar62);
  auVar93 = ZEXT1664(local_25d8);
  auVar79 = ZEXT816(0) << 0x40;
  auVar87 = ZEXT1664(auVar79);
  auVar75 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar79);
  local_2618 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar79);
  auVar89 = ZEXT1664(auVar5 ^ auVar54);
  auVar65 = vcmpps_avx(auVar65,auVar79,1);
  auVar62._8_4_ = 1;
  auVar62._0_8_ = 0x100000001;
  auVar62._12_4_ = 1;
  auVar65 = vandps_avx(auVar65,auVar62);
  auVar58 = vcmpps_avx(auVar58,auVar79,1);
  auVar73._8_4_ = 2;
  auVar73._0_8_ = 0x200000002;
  auVar73._12_4_ = 2;
  auVar58 = vandps_avx(auVar58,auVar73);
  auVar58 = vorps_avx(auVar58,auVar65);
  auVar63._8_4_ = 4;
  auVar63._0_8_ = 0x400000004;
  auVar63._12_4_ = 4;
  auVar65 = vcmpps_avx(auVar88,auVar79,1);
  auVar65 = vandps_avx(auVar65,auVar63);
  auVar5 = vpor_avx(auVar5 ^ auVar54,auVar65);
  local_2698 = vpor_avx(auVar5,auVar58);
  local_25e8 = *(float *)ray;
  fStack_25e4 = *(float *)(ray + 4);
  fStack_25e0 = *(float *)(ray + 8);
  fStack_25dc = *(float *)(ray + 0xc);
  fVar60 = local_25b8._0_4_ * -*(float *)ray;
  fVar66 = local_25b8._4_4_ * -*(float *)(ray + 4);
  fVar68 = local_25b8._8_4_ * -*(float *)(ray + 8);
  fVar70 = local_25b8._12_4_ * -*(float *)(ray + 0xc);
  local_25f8 = *(float *)(ray + 0x10);
  fStack_25f4 = *(float *)(ray + 0x14);
  fStack_25f0 = *(float *)(ray + 0x18);
  fStack_25ec = *(float *)(ray + 0x1c);
  fVar61 = local_25c8._0_4_ * -*(float *)(ray + 0x10);
  fVar67 = local_25c8._4_4_ * -*(float *)(ray + 0x14);
  fVar69 = local_25c8._8_4_ * -*(float *)(ray + 0x18);
  fVar71 = local_25c8._12_4_ * -*(float *)(ray + 0x1c);
  local_2608 = *(float *)(ray + 0x20);
  fStack_2604 = *(float *)(ray + 0x24);
  fStack_2600 = *(float *)(ray + 0x28);
  fStack_25fc = *(float *)(ray + 0x2c);
  local_2538 = local_25d8._0_4_ * -*(float *)(ray + 0x20);
  fStack_2534 = local_25d8._4_4_ * -*(float *)(ray + 0x24);
  fStack_2530 = local_25d8._8_4_ * -*(float *)(ray + 0x28);
  fStack_252c = local_25d8._12_4_ * -*(float *)(ray + 0x2c);
  local_2598 = mm_lookupmask_ps._0_8_;
  uStack_2590 = mm_lookupmask_ps._8_8_;
  local_2628 = 0x7f800000;
  uStack_2624 = 0x7f800000;
  uStack_2620 = 0x7f800000;
  uStack_261c = 0x7f800000;
LAB_0168849f:
  lVar17 = 0;
  for (uVar38 = uVar41; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
    lVar17 = lVar17 + 1;
  }
  uVar34 = *(undefined4 *)(local_2698 + lVar17 * 4);
  auVar54._4_4_ = uVar34;
  auVar54._0_4_ = uVar34;
  auVar54._8_4_ = uVar34;
  auVar54._12_4_ = uVar34;
  local_26c8 = vpcmpeqd_avx(auVar54,local_2698);
  uVar34 = vmovmskps_avx(local_26c8);
  local_2650 = (Geometry *)CONCAT44((int)((ulong)lVar17 >> 0x20),uVar34);
  uVar41 = ~(ulong)local_2650 & uVar41;
  auVar19._4_4_ = fStack_25e4;
  auVar19._0_4_ = local_25e8;
  auVar19._8_4_ = fStack_25e0;
  auVar19._12_4_ = fStack_25dc;
  auVar84._8_4_ = 0x7f800000;
  auVar84._0_8_ = 0x7f8000007f800000;
  auVar84._12_4_ = 0x7f800000;
  auVar5 = vblendvps_avx(auVar84,auVar19,local_26c8);
  auVar54 = vshufps_avx(auVar5,auVar5,0xb1);
  auVar5 = vminps_avx(auVar54,auVar5);
  auVar54 = vshufpd_avx(auVar5,auVar5,1);
  auVar54 = vminps_avx(auVar54,auVar5);
  auVar6._4_4_ = fStack_25f4;
  auVar6._0_4_ = local_25f8;
  auVar6._8_4_ = fStack_25f0;
  auVar6._12_4_ = fStack_25ec;
  auVar5 = vblendvps_avx(auVar84,auVar6,local_26c8);
  auVar65 = vshufps_avx(auVar5,auVar5,0xb1);
  auVar5 = vminps_avx(auVar65,auVar5);
  auVar65 = vshufpd_avx(auVar5,auVar5,1);
  auVar5 = vminps_avx(auVar65,auVar5);
  auVar54 = vinsertps_avx(auVar54,auVar5,0x1c);
  auVar88._4_4_ = fStack_2604;
  auVar88._0_4_ = local_2608;
  auVar88._8_4_ = fStack_2600;
  auVar88._12_4_ = fStack_25fc;
  auVar5 = vblendvps_avx(auVar84,auVar88,local_26c8);
  auVar65 = vshufps_avx(auVar5,auVar5,0xb1);
  auVar5 = vminps_avx(auVar65,auVar5);
  auVar65 = vshufpd_avx(auVar5,auVar5,1);
  auVar5 = vminps_avx(auVar65,auVar5);
  auVar58 = vinsertps_avx(auVar54,auVar5,0x20);
  auVar82._8_4_ = 0xff800000;
  auVar82._0_8_ = 0xff800000ff800000;
  auVar82._12_4_ = 0xff800000;
  auVar5 = vblendvps_avx(auVar82,auVar19,local_26c8);
  auVar54 = vshufps_avx(auVar5,auVar5,0xb1);
  auVar5 = vmaxps_avx(auVar54,auVar5);
  auVar54 = vshufpd_avx(auVar5,auVar5,1);
  auVar54 = vmaxps_avx(auVar54,auVar5);
  auVar5 = vblendvps_avx(auVar82,auVar6,local_26c8);
  auVar65 = vshufps_avx(auVar5,auVar5,0xb1);
  auVar5 = vmaxps_avx(auVar65,auVar5);
  auVar65 = vshufpd_avx(auVar5,auVar5,1);
  auVar5 = vmaxps_avx(auVar65,auVar5);
  auVar54 = vinsertps_avx(auVar54,auVar5,0x1c);
  auVar5 = vblendvps_avx(auVar82,auVar88,local_26c8);
  auVar65 = vshufps_avx(auVar5,auVar5,0xb1);
  auVar5 = vmaxps_avx(auVar65,auVar5);
  auVar65 = vshufpd_avx(auVar5,auVar5,1);
  auVar5 = vmaxps_avx(auVar65,auVar5);
  auVar88 = vinsertps_avx(auVar54,auVar5,0x20);
  auVar5 = vblendvps_avx(auVar84,auVar91._0_16_,local_26c8);
  auVar54 = vshufps_avx(auVar5,auVar5,0xb1);
  auVar5 = vminps_avx(auVar54,auVar5);
  auVar54 = vshufpd_avx(auVar5,auVar5,1);
  auVar54 = vminps_avx(auVar54,auVar5);
  auVar5 = vblendvps_avx(auVar84,auVar92._0_16_,local_26c8);
  auVar65 = vshufps_avx(auVar5,auVar5,0xb1);
  auVar5 = vminps_avx(auVar65,auVar5);
  auVar65 = vshufpd_avx(auVar5,auVar5,1);
  auVar5 = vminps_avx(auVar65,auVar5);
  auVar54 = vinsertps_avx(auVar54,auVar5,0x1c);
  auVar5 = vblendvps_avx(auVar84,auVar93._0_16_,local_26c8);
  auVar65 = vshufps_avx(auVar5,auVar5,0xb1);
  auVar5 = vminps_avx(auVar65,auVar5);
  auVar65 = vshufpd_avx(auVar5,auVar5,1);
  auVar5 = vminps_avx(auVar65,auVar5);
  auVar62 = vinsertps_avx(auVar54,auVar5,0x20);
  auVar5 = vblendvps_avx(auVar82,auVar91._0_16_,local_26c8);
  auVar54 = vshufps_avx(auVar5,auVar5,0xb1);
  auVar5 = vmaxps_avx(auVar54,auVar5);
  auVar54 = vshufpd_avx(auVar5,auVar5,1);
  auVar54 = vmaxps_avx(auVar54,auVar5);
  auVar5 = vblendvps_avx(auVar82,auVar92._0_16_,local_26c8);
  auVar65 = vshufps_avx(auVar5,auVar5,0xb1);
  auVar5 = vmaxps_avx(auVar65,auVar5);
  auVar65 = vshufpd_avx(auVar5,auVar5,1);
  auVar5 = vmaxps_avx(auVar65,auVar5);
  auVar54 = vinsertps_avx(auVar54,auVar5,0x1c);
  auVar5 = vblendvps_avx(auVar82,auVar93._0_16_,local_26c8);
  auVar65 = vshufps_avx(auVar5,auVar5,0xb1);
  auVar5 = vmaxps_avx(auVar65,auVar5);
  auVar65 = vshufpd_avx(auVar5,auVar5,1);
  auVar5 = vmaxps_avx(auVar65,auVar5);
  auVar63 = vinsertps_avx(auVar54,auVar5,0x20);
  auVar5 = vblendvps_avx(auVar84,auVar75,local_26c8);
  auVar54 = vshufps_avx(auVar5,auVar5,0xb1);
  auVar79 = vminps_avx(auVar54,auVar5);
  auVar6 = vshufpd_avx(auVar79,auVar79,1);
  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 vblendvps_avx(auVar82,local_2618,local_26c8);
  auVar5 = vshufps_avx((undefined1  [16])bi_8.field_0,(undefined1  [16])bi_8.field_0,0xb1);
  auVar73 = vmaxps_avx(auVar5,(undefined1  [16])bi_8.field_0);
  auVar65 = vcmpps_avx(auVar62,auVar87._0_16_,5);
  auVar5 = vblendvps_avx(auVar63,auVar62,auVar65);
  auVar54 = vblendvps_avx(auVar58,auVar88,auVar65);
  local_2578 = auVar54._0_4_;
  fStack_2574 = auVar54._4_4_;
  fStack_2570 = auVar54._8_4_;
  fStack_256c = auVar54._12_4_;
  auVar54 = vblendvps_avx(auVar88,auVar58,auVar65);
  auVar58 = vshufpd_avx(auVar73,auVar73,1);
  local_2558 = auVar5._0_4_;
  auVar81 = vmovshdup_avx(auVar5);
  uVar38 = (ulong)(auVar81._0_4_ < 0.0) << 5 | 0x40;
  auVar88 = vshufpd_avx(auVar5,auVar5,1);
  uVar49 = (ulong)(auVar88._0_4_ < 0.0) << 5 | 0x80;
  auVar88 = vminps_avx(auVar6,auVar79);
  auVar58 = vmaxps_avx(auVar58,auVar73);
  auVar89 = ZEXT1664(auVar89._0_16_);
  auVar65 = vblendvps_avx(auVar62,auVar63,auVar65);
  auVar83._0_4_ = local_2558 * local_2578;
  auVar83._4_4_ = auVar5._4_4_ * fStack_2574;
  auVar83._8_4_ = auVar5._8_4_ * fStack_2570;
  auVar83._12_4_ = auVar5._12_4_ * fStack_256c;
  fVar4 = auVar65._0_4_;
  auVar76._0_4_ = auVar54._0_4_ * fVar4;
  auVar76._4_4_ = auVar54._4_4_ * auVar65._4_4_;
  auVar76._8_4_ = auVar54._8_4_ * auVar65._8_4_;
  auVar76._12_4_ = auVar54._12_4_ * auVar65._12_4_;
  auVar87 = ZEXT864(0) << 0x20;
  uVar50 = (ulong)(local_2558 < 0.0) * 0x20;
  stack[0].ptr.ptr = *(size_t *)&pAVar2[1].bounds.bounds0.lower.field_0;
  stack[0].mask = (size_t)local_2650;
  fStack_2554 = local_2558;
  fStack_2550 = local_2558;
  fStack_254c = local_2558;
  fStack_2548 = local_2558;
  fStack_2544 = local_2558;
  fStack_2540 = local_2558;
  fStack_253c = local_2558;
  local_2578 = -auVar83._0_4_;
  fStack_2574 = -auVar83._0_4_;
  fStack_2570 = -auVar83._0_4_;
  fStack_256c = -auVar83._0_4_;
  fStack_2568 = -auVar83._0_4_;
  fStack_2564 = -auVar83._0_4_;
  fStack_2560 = -auVar83._0_4_;
  fStack_255c = -auVar83._0_4_;
  local_2748 = auVar81._0_8_;
  auVar54 = vmovshdup_avx(auVar83);
  uVar33 = auVar54._0_4_;
  uVar10 = auVar54._4_4_;
  auVar5 = vshufps_avx(auVar5,auVar5,0xaa);
  uVar51 = auVar5._0_8_;
  auVar63 = vshufps_avx(auVar83,auVar83,0xaa);
  uVar7 = auVar63._0_4_;
  uVar11 = auVar63._4_4_;
  auVar5 = vmovshdup_avx(auVar65);
  uVar52 = auVar5._0_8_;
  auVar62 = vmovshdup_avx(auVar76);
  uVar8 = auVar62._0_4_;
  uVar12 = auVar62._4_4_;
  auVar5 = vshufps_avx(auVar65,auVar65,0xaa);
  uVar53 = auVar5._0_8_;
  auVar65 = vshufps_avx(auVar76,auVar76,0xaa);
  uVar9 = auVar65._0_4_;
  uVar13 = auVar65._4_4_;
  uVar34 = auVar88._0_4_;
  uVar78 = auVar58._0_4_;
  pSVar48 = stack + 1;
  auVar5._4_4_ = uStack_2624;
  auVar5._0_4_ = local_2628;
  auVar5._8_4_ = uStack_2620;
  auVar5._12_4_ = uStack_261c;
  auVar5 = vblendvps_avx(auVar5,auVar75,local_26c8);
  auVar85 = ZEXT1664(CONCAT412(fVar70,CONCAT48(fVar68,CONCAT44(fVar66,fVar60))));
  auVar86 = ZEXT1664(CONCAT412(fVar71,CONCAT48(fVar69,CONCAT44(fVar67,fVar61))));
  auVar58 = auVar5;
LAB_0168888e:
  auVar59 = ZEXT1664(auVar58);
  local_25a8 = auVar89._0_16_;
  uVar35 = vmovmskps_avx(local_25a8);
  pSVar47 = pSVar48;
  do {
    auVar58 = auVar59._0_16_;
    if (pSVar47 == stack) goto LAB_01688c90;
    pSVar48 = pSVar47 + -1;
    pSVar32 = pSVar47 + -1;
    pSVar47 = pSVar48;
    if ((pSVar32->mask & ~CONCAT44((int)((ulong)local_2650 >> 0x20),uVar35)) != 0) {
      sVar45 = 1;
      sVar39 = (pSVar48->ptr).ptr;
      do {
        pSVar47 = pSVar48;
        if ((sVar39 & 8) != 0) {
          if (sVar45 != 0) {
            pGVar36 = (Geometry *)((ulong)((uint)sVar39 & 0xf) - 8);
            pGVar44 = (Geometry *)0x0;
            local_2650 = pGVar36;
            local_2588 = local_25a8 ^ auVar90._0_16_;
            goto LAB_01688add;
          }
          break;
        }
        auVar14._4_4_ = fStack_2574;
        auVar14._0_4_ = local_2578;
        auVar14._8_4_ = fStack_2570;
        auVar14._12_4_ = fStack_256c;
        auVar14._16_4_ = fStack_2568;
        auVar14._20_4_ = fStack_2564;
        auVar14._24_4_ = fStack_2560;
        auVar14._28_4_ = fStack_255c;
        auVar15._4_4_ = fStack_2554;
        auVar15._0_4_ = local_2558;
        auVar15._8_4_ = fStack_2550;
        auVar15._12_4_ = fStack_254c;
        auVar15._16_4_ = fStack_2548;
        auVar15._20_4_ = fStack_2544;
        auVar15._24_4_ = fStack_2540;
        auVar15._28_4_ = fStack_253c;
        auVar58 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar39 + 0x40 + uVar50),auVar14,auVar15);
        auVar30._8_4_ = uVar33 ^ 0x80000000;
        auVar30._0_8_ = auVar54._0_8_ ^ 0x8000000080000000;
        auVar30._12_4_ = uVar10 ^ 0x80000000;
        auVar30._16_4_ = uVar33 ^ 0x80000000;
        auVar30._20_4_ = uVar10 ^ 0x80000000;
        auVar30._24_4_ = uVar33 ^ 0x80000000;
        auVar30._28_4_ = uVar10 ^ 0x80000000;
        auVar31._8_8_ = local_2748;
        auVar31._0_8_ = local_2748;
        auVar31._16_8_ = local_2748;
        auVar31._24_8_ = local_2748;
        auVar88 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar39 + 0x40 + uVar38),auVar30,auVar31);
        auVar14 = vpmaxsd_avx2(ZEXT1632(auVar58),ZEXT1632(auVar88));
        auVar28._8_4_ = uVar7 ^ 0x80000000;
        auVar28._0_8_ = auVar63._0_8_ ^ 0x8000000080000000;
        auVar28._12_4_ = uVar11 ^ 0x80000000;
        auVar28._16_4_ = uVar7 ^ 0x80000000;
        auVar28._20_4_ = uVar11 ^ 0x80000000;
        auVar28._24_4_ = uVar7 ^ 0x80000000;
        auVar28._28_4_ = uVar11 ^ 0x80000000;
        auVar29._8_8_ = uVar51;
        auVar29._0_8_ = uVar51;
        auVar29._16_8_ = uVar51;
        auVar29._24_8_ = uVar51;
        auVar58 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar39 + 0x40 + uVar49),auVar28,auVar29);
        auVar21._4_4_ = uVar34;
        auVar21._0_4_ = uVar34;
        auVar21._8_4_ = uVar34;
        auVar21._12_4_ = uVar34;
        auVar21._16_4_ = uVar34;
        auVar21._20_4_ = uVar34;
        auVar21._24_4_ = uVar34;
        auVar21._28_4_ = uVar34;
        auVar15 = vpmaxsd_avx2(ZEXT1632(auVar58),auVar21);
        auVar14 = vpmaxsd_avx2(auVar14,auVar15);
        uVar46 = CONCAT44(auVar76._0_4_,auVar76._0_4_);
        auVar26._8_4_ = -auVar76._0_4_;
        auVar26._0_8_ = uVar46 ^ 0x8000000080000000;
        auVar26._12_4_ = -auVar76._0_4_;
        auVar26._16_4_ = -auVar76._0_4_;
        auVar26._20_4_ = -auVar76._0_4_;
        auVar26._24_4_ = -auVar76._0_4_;
        auVar26._28_4_ = -auVar76._0_4_;
        auVar27._4_4_ = fVar4;
        auVar27._0_4_ = fVar4;
        auVar27._8_4_ = fVar4;
        auVar27._12_4_ = fVar4;
        auVar27._16_4_ = fVar4;
        auVar27._20_4_ = fVar4;
        auVar27._24_4_ = fVar4;
        auVar27._28_4_ = fVar4;
        auVar58 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar39 + 0x40 + (uVar50 ^ 0x20)),auVar26,
                                  auVar27);
        auVar24._8_4_ = uVar8 ^ 0x80000000;
        auVar24._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
        auVar24._12_4_ = uVar12 ^ 0x80000000;
        auVar24._16_4_ = uVar8 ^ 0x80000000;
        auVar24._20_4_ = uVar12 ^ 0x80000000;
        auVar24._24_4_ = uVar8 ^ 0x80000000;
        auVar24._28_4_ = uVar12 ^ 0x80000000;
        auVar25._8_8_ = uVar52;
        auVar25._0_8_ = uVar52;
        auVar25._16_8_ = uVar52;
        auVar25._24_8_ = uVar52;
        auVar88 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar39 + 0x40 + (uVar38 ^ 0x20)),auVar24,
                                  auVar25);
        auVar15 = vpminsd_avx2(ZEXT1632(auVar58),ZEXT1632(auVar88));
        auVar22._8_4_ = uVar9 ^ 0x80000000;
        auVar22._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
        auVar22._12_4_ = uVar13 ^ 0x80000000;
        auVar22._16_4_ = uVar9 ^ 0x80000000;
        auVar22._20_4_ = uVar13 ^ 0x80000000;
        auVar22._24_4_ = uVar9 ^ 0x80000000;
        auVar22._28_4_ = uVar13 ^ 0x80000000;
        auVar23._8_8_ = uVar53;
        auVar23._0_8_ = uVar53;
        auVar23._16_8_ = uVar53;
        auVar23._24_8_ = uVar53;
        auVar58 = vfmadd132ps_fma(*(undefined1 (*) [32])(sVar39 + 0x40 + (uVar49 ^ 0x20)),auVar22,
                                  auVar23);
        auVar16._4_4_ = uVar78;
        auVar16._0_4_ = uVar78;
        auVar16._8_4_ = uVar78;
        auVar16._12_4_ = uVar78;
        auVar16._16_4_ = uVar78;
        auVar16._20_4_ = uVar78;
        auVar16._24_4_ = uVar78;
        auVar16._28_4_ = uVar78;
        auVar16 = vpminsd_avx2(ZEXT1632(auVar58),auVar16);
        auVar15 = vpminsd_avx2(auVar15,auVar16);
        auVar14 = vcmpps_avx(auVar14,auVar15,2);
        auVar59 = ZEXT3264(auVar14);
        uVar40 = vmovmskps_avx(auVar14);
        if (uVar40 == 0) break;
        uVar46 = (ulong)(uVar40 & 0xff);
        sVar45 = 0;
        sVar42 = 8;
        do {
          lVar17 = 0;
          for (uVar18 = uVar46; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
            lVar17 = lVar17 + 1;
          }
          uVar1 = *(undefined4 *)(sVar39 + 0x40 + lVar17 * 4);
          auVar55._4_4_ = uVar1;
          auVar55._0_4_ = uVar1;
          auVar55._8_4_ = uVar1;
          auVar55._12_4_ = uVar1;
          auVar73 = vfmadd213ps_fma(auVar55,auVar91._0_16_,auVar85._0_16_);
          uVar1 = *(undefined4 *)(sVar39 + 0x80 + lVar17 * 4);
          auVar64._4_4_ = uVar1;
          auVar64._0_4_ = uVar1;
          auVar64._8_4_ = uVar1;
          auVar64._12_4_ = uVar1;
          auVar79 = vfmadd213ps_fma(auVar64,auVar92._0_16_,auVar86._0_16_);
          uVar1 = *(undefined4 *)(sVar39 + 0xc0 + lVar17 * 4);
          auVar72._4_4_ = uVar1;
          auVar72._0_4_ = uVar1;
          auVar72._8_4_ = uVar1;
          auVar72._12_4_ = uVar1;
          auVar20._4_4_ = fStack_2534;
          auVar20._0_4_ = local_2538;
          auVar20._8_4_ = fStack_2530;
          auVar20._12_4_ = fStack_252c;
          auVar81 = vfmadd213ps_fma(auVar72,auVar93._0_16_,auVar20);
          uVar1 = *(undefined4 *)(sVar39 + 0x60 + lVar17 * 4);
          auVar74._4_4_ = uVar1;
          auVar74._0_4_ = uVar1;
          auVar74._8_4_ = uVar1;
          auVar74._12_4_ = uVar1;
          auVar6 = vfmadd213ps_fma(auVar74,auVar91._0_16_,auVar85._0_16_);
          uVar1 = *(undefined4 *)(sVar39 + 0xa0 + lVar17 * 4);
          auVar77._4_4_ = uVar1;
          auVar77._0_4_ = uVar1;
          auVar77._8_4_ = uVar1;
          auVar77._12_4_ = uVar1;
          auVar19 = vfmadd213ps_fma(auVar77,auVar92._0_16_,auVar86._0_16_);
          uVar1 = *(undefined4 *)(sVar39 + 0xe0 + lVar17 * 4);
          auVar80._4_4_ = uVar1;
          auVar80._0_4_ = uVar1;
          auVar80._8_4_ = uVar1;
          auVar80._12_4_ = uVar1;
          auVar82 = vfmadd213ps_fma(auVar80,auVar93._0_16_,auVar20);
          auVar58 = vpminsd_avx(auVar73,auVar6);
          auVar88 = vpminsd_avx(auVar79,auVar19);
          auVar58 = vpmaxsd_avx(auVar58,auVar88);
          auVar88 = vpminsd_avx(auVar81,auVar82);
          auVar88 = vpmaxsd_avx(auVar88,auVar5);
          auVar58 = vpmaxsd_avx(auVar58,auVar88);
          auVar88 = vpmaxsd_avx(auVar73,auVar6);
          auVar73 = vpmaxsd_avx(auVar79,auVar19);
          auVar73 = vpminsd_avx(auVar88,auVar73);
          auVar88 = vpmaxsd_avx(auVar81,auVar82);
          auVar88 = vpminsd_avx(auVar88,(undefined1  [16])bi_8.field_0);
          auVar88 = vpminsd_avx(auVar73,auVar88);
          auVar58 = vcmpps_avx(auVar58,auVar88,2);
          auVar59 = ZEXT1664(auVar58);
          uVar40 = vmovmskps_avx(auVar58);
          sVar43 = sVar42;
          if (uVar40 != 0) {
            sVar43 = *(size_t *)(sVar39 + lVar17 * 8);
            if (sVar42 != 8) {
              (pSVar48->ptr).ptr = sVar42;
              pSVar48->mask = sVar45;
              pSVar48 = pSVar48 + 1;
            }
            sVar45 = (size_t)(uVar40 & 0xff);
          }
          uVar46 = uVar46 - 1 & uVar46;
          sVar42 = sVar43;
        } while (uVar46 != 0);
        sVar39 = sVar43;
        pSVar47 = pSVar48;
      } while (sVar43 != 8);
    }
  } while( true );
  while( true ) {
    local_2680.geomID = *(uint *)((sVar39 & 0xfffffffffffffff0) + (long)pGVar44 * 8);
    local_2650 = (context->scene->geometries).items[local_2680.geomID].ptr;
    uVar40 = local_2650->mask;
    auVar56._4_4_ = uVar40;
    auVar56._0_4_ = uVar40;
    auVar56._8_4_ = uVar40;
    auVar56._12_4_ = uVar40;
    auVar58 = vpand_avx(auVar56,*(undefined1 (*) [16])(ray + 0x90));
    auVar58 = vpcmpeqd_avx(auVar87._0_16_,auVar58);
    auVar88 = local_2588 & ~auVar58;
    auVar3._8_8_ = uStack_2590;
    auVar3._0_8_ = local_2598;
    if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar88 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar88 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar88[0xf] < '\0')
    {
      mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vandnps_avx(auVar58,local_2588);
      local_2680.primID = *(uint *)((sVar39 & 0xfffffffffffffff0) + 4 + (long)pGVar44 * 8);
      local_2680.valid = (int *)&mask;
      local_2680.geometryUserPtr = local_2650->userPtr;
      local_2680.context = context->user;
      local_2680.N = 4;
      local_2648 = 0;
      local_2640 = context->args;
      p_Var37 = local_2640->intersect;
      if (p_Var37 == (RTCIntersectFunctionN)0x0) {
        p_Var37 = (RTCIntersectFunctionN)
                  local_2650[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      }
      auVar58 = auVar90._0_16_;
      local_2680.rayhit = (RTCRayHitN *)ray;
      local_2650 = (Geometry *)(*p_Var37)(&local_2680);
      auVar87 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar3 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,1);
      auVar58 = vpcmpeqd_avx(auVar58,auVar58);
      auVar90 = ZEXT1664(auVar58);
      auVar91 = ZEXT1664(local_25b8);
      auVar92 = ZEXT1664(local_25c8);
      auVar93 = ZEXT1664(local_25d8);
      auVar89 = ZEXT1664(local_25a8);
      auVar85 = ZEXT1664(CONCAT412(fVar70,CONCAT48(fVar68,CONCAT44(fVar66,fVar60))));
      auVar86 = ZEXT1664(CONCAT412(fVar71,CONCAT48(fVar69,CONCAT44(fVar67,fVar61))));
    }
    auVar88 = auVar89._0_16_;
    auVar58 = vandnps_avx(auVar3,local_2588);
    pGVar44 = (Geometry *)((long)&(pGVar44->super_RefCount)._vptr_RefCount + 1);
    auVar73 = local_2588 & ~auVar3;
    local_2588 = auVar58;
    if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar73 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar73 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar73[0xf])
    break;
LAB_01688add:
    auVar88 = auVar89._0_16_;
    auVar58 = local_2588;
    if (pGVar36 == pGVar44) break;
  }
  auVar57._0_4_ = auVar90._0_4_ ^ auVar58._0_4_;
  auVar57._4_4_ = auVar90._4_4_ ^ auVar58._4_4_;
  auVar57._8_4_ = auVar90._8_4_ ^ auVar58._8_4_;
  auVar57._12_4_ = auVar90._12_4_ ^ auVar58._12_4_;
  auVar88 = vorps_avx(auVar88,auVar57);
  auVar89 = ZEXT1664(auVar88);
  auVar73 = local_26c8 & ~auVar88;
  auVar58 = local_26c8;
  if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar73 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar73 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar73[0xf])
  goto LAB_01688c90;
  local_26c8 = vandnps_avx(auVar88,local_26c8);
  auVar58._8_4_ = 0xff800000;
  auVar58._0_8_ = 0xff800000ff800000;
  auVar58._12_4_ = 0xff800000;
  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 vblendvps_avx((undefined1  [16])bi_8.field_0,auVar58,auVar88);
  goto LAB_0168888e;
LAB_01688c90:
  if (uVar41 == 0) {
    auVar5 = vpcmpeqd_avx(auVar58,auVar58);
    auVar5 = vpcmpeqd_avx(auVar5,(undefined1  [16])local_2638);
    auVar5 = vpand_avx(auVar89._0_16_,auVar5);
    auVar65._8_4_ = 0xff800000;
    auVar65._0_8_ = 0xff800000ff800000;
    auVar65._12_4_ = 0xff800000;
    auVar5 = vmaskmovps_avx(auVar5,auVar65);
    *(undefined1 (*) [16])(ray + 0x80) = auVar5;
    return;
  }
  goto LAB_0168849f;
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }